

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

void __thiscall
QtPrivate::QTypeNormalizer::normalizeIntegerTypes(QTypeNormalizer *this,char **begin,char *end)

{
  bool bVar1;
  int iVar2;
  char *x;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  local_3c = 0;
  x = "char";
  local_40 = 0;
  local_4c = 0;
  local_48 = 0;
  local_44 = 0;
  iVar2 = 0;
  while (*begin < end) {
    bVar1 = skipToken(begin,end,"long",false);
    if (bVar1) {
      local_3c = local_3c + 1;
    }
    else {
      bVar1 = skipToken(begin,end,"int",false);
      if (bVar1) {
        local_48 = local_48 + 1;
      }
      else {
        bVar1 = skipToken(begin,end,"short",false);
        if (bVar1) {
          local_44 = local_44 + 1;
        }
        else {
          bVar1 = skipToken(begin,end,"unsigned",false);
          if (bVar1) {
            local_4c = local_4c + 1;
          }
          else {
            bVar1 = skipToken(begin,end,"signed",false);
            if (bVar1) {
              local_40 = local_40 + 1;
            }
            else {
              bVar1 = skipToken(begin,end,"char",false);
              if (!bVar1) break;
              iVar2 = iVar2 + 1;
            }
          }
        }
      }
    }
  }
  if (local_3c == 2) {
    append(this,'q');
  }
  if ((local_40 == 0) || (iVar2 == 0)) {
    if (local_4c != 0) {
      appendStr(this,"u");
    }
    if ((iVar2 == 0) && (x = "short", local_44 == 0)) {
      x = "longlong";
      if (local_3c == 1) {
        x = "long";
      }
      if ((1 < local_3c - 1U) && (x = "int", (local_4c == 0 && local_40 == 0) && local_48 == 0)) {
        return;
      }
    }
  }
  else {
    appendStr(this,"signed ");
  }
  appendStr(this,x);
  return;
}

Assistant:

constexpr void normalizeIntegerTypes(const char *&begin, const char *end)
    {
        int numLong = 0;
        int numSigned = 0;
        int numUnsigned = 0;
        int numInt = 0;
        int numShort = 0;
        int numChar = 0;
        while (begin < end) {
            if (skipToken(begin, end, "long")) {
                numLong++;
                continue;
            }
            if (skipToken(begin, end, "int")) {
                numInt++;
                continue;
            }
            if (skipToken(begin, end, "short")) {
                numShort++;
                continue;
            }
            if (skipToken(begin, end, "unsigned")) {
                numUnsigned++;
                continue;
            }
            if (skipToken(begin, end, "signed")) {
                numSigned++;
                continue;
            }
            if (skipToken(begin, end, "char")) {
                numChar++;
                continue;
            }
#ifdef Q_CC_MSVC
            if (skipToken(begin, end, "__int64")) {
                numLong = 2;
                continue;
            }
#endif
            break;
        }
        if (numLong == 2)
            append('q'); // q(u)longlong
        if (numSigned && numChar)
            appendStr("signed ");
        else if (numUnsigned)
            appendStr("u");
        if (numChar)
            appendStr("char");
        else if (numShort)
            appendStr("short");
        else if (numLong == 1)
            appendStr("long");
        else if (numLong == 2)
            appendStr("longlong");
        else if (numUnsigned || numSigned || numInt)
            appendStr("int");
    }